

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t header_ustar(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  archive_string *as;
  char cVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  dev_t dVar4;
  wchar_t wVar5;
  
  as = &tar->entry_pathname;
  cVar1 = *(char *)((long)h + 0x159);
  (tar->entry_pathname).length = 0;
  if ((cVar1 != '\0') &&
     (archive_strncat(as,(void *)((long)h + 0x159),0x9b),
     (tar->entry_pathname).s[(tar->entry_pathname).length - 1] != '/')) {
    archive_strappend_char(as,'/');
  }
  archive_strncat(as,h,100);
  wVar2 = _archive_entry_copy_pathname_l
                    (entry,(tar->entry_pathname).s,(tar->entry_pathname).length,tar->sconv);
  if (wVar2 == L'\0') {
    wVar2 = L'\0';
  }
  else {
    wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname");
    if (wVar2 == L'\xffffffe2') {
      return L'\xffffffe2';
    }
  }
  wVar3 = header_common(a,tar,entry,h);
  wVar5 = L'\xffffffe2';
  if (wVar3 != L'\xffffffe2') {
    if (wVar3 < wVar2) {
      wVar2 = wVar3;
    }
    wVar3 = _archive_entry_copy_uname_l(entry,(char *)((long)h + 0x109),0x20,tar->sconv);
    if (((wVar3 == L'\0') ||
        (wVar2 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar2 != L'\xffffffe2')) &&
       ((wVar3 = _archive_entry_copy_gname_l(entry,(char *)((long)h + 0x129),0x20,tar->sconv),
        wVar3 == L'\0' ||
        (wVar2 = set_conversion_failed_error(a,tar->sconv,"Gname"), wVar2 != L'\xffffffe2')))) {
      if ((byte)(*(char *)((long)h + 0x9c) - 0x33U) < 2) {
        dVar4 = tar_atol((char *)((long)h + 0x149),8);
        archive_entry_set_rdevmajor(entry,dVar4);
        dVar4 = tar_atol((char *)((long)h + 0x151),8);
        archive_entry_set_rdevminor(entry,dVar4);
      }
      tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
      wVar5 = wVar2;
    }
  }
  return wVar5;
}

Assistant:

static int
header_ustar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	struct archive_string *as;
	int err = ARCHIVE_OK, r;

	header = (const struct archive_entry_header_ustar *)h;

	/* Copy name into an internal buffer to ensure null-termination. */
	as = &(tar->entry_pathname);
	if (header->prefix[0]) {
		archive_strncpy(as, header->prefix, sizeof(header->prefix));
		if (as->s[archive_strlen(as) - 1] != '/')
			archive_strappend_char(as, '/');
		archive_strncat(as, header->name, sizeof(header->name));
	} else {
		archive_strncpy(as, header->name, sizeof(header->name));
	}
	if (archive_entry_copy_pathname_l(entry, as->s, archive_strlen(as),
	    tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Handle rest of common fields. */
	r = header_common(a, tar, entry, h);
	if (r == ARCHIVE_FATAL)
		return (r);
	if (r < err)
		err = r;

	/* Handle POSIX ustar fields. */
	if (archive_entry_copy_uname_l(entry,
	    header->uname, sizeof(header->uname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Uname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	if (archive_entry_copy_gname_l(entry,
	    header->gname, sizeof(header->gname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Gname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Parse out device numbers only for char and block specials. */
	if (header->typeflag[0] == '3' || header->typeflag[0] == '4') {
		archive_entry_set_rdevmajor(entry, (dev_t)
		    tar_atol(header->rdevmajor, sizeof(header->rdevmajor)));
		archive_entry_set_rdevminor(entry, (dev_t)
		    tar_atol(header->rdevminor, sizeof(header->rdevminor)));
	}

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);

	return (err);
}